

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O0

void __thiscall
embree::SceneGraph::GroupNode::GroupNode
          (GroupNode *this,
          vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
          *children)

{
  undefined8 *in_RDI;
  vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
  *in_stack_00000028;
  vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
  *in_stack_00000030;
  Node *in_stack_ffffffffffffffe0;
  
  Node::Node(in_stack_ffffffffffffffe0,SUB81((ulong)in_RDI >> 0x38,0));
  *in_RDI = &PTR__GroupNode_00600138;
  std::
  vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
  ::vector(in_stack_00000030,in_stack_00000028);
  return;
}

Assistant:

GroupNode (std::vector<Ref<Node>>& children)
        : children(children) {}